

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it)

{
  ushort uVar1;
  ushort uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint32_t limit;
  run_container_t *rc;
  array_container_t *ac;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  roaring_uint32_iterator_t *it_local;
  
  if (it->container_index < (it->parent->high_low_container).size) {
    if (it->container_index < 0) {
      it->container_index = 0;
      it_local._7_1_ = loadfirstvalue(it);
      it->has_value = it_local._7_1_;
    }
    else {
      if (it->typecode == '\x01') {
        it->in_container_index = it->in_container_index + 1;
        word._4_4_ = it->in_container_index / 0x40;
        if (word._4_4_ < 0x400) {
          ac = (array_container_t *)
               (*(ulong *)(*(long *)((long)it->container + 8) + (ulong)word._4_4_ * 8) &
               -1L << ((byte)((long)it->in_container_index % 0x40) & 0x3f));
          while (ac == (array_container_t *)0x0 && word._4_4_ + 1 < 0x400) {
            word._4_4_ = word._4_4_ + 1;
            ac = *(array_container_t **)(*(long *)((long)it->container + 8) + (ulong)word._4_4_ * 8)
            ;
          }
          if (ac != (array_container_t *)0x0) {
            iVar5 = 0;
            for (; ((ulong)ac & 1) == 0;
                ac = (array_container_t *)((ulong)ac >> 1 | 0x8000000000000000)) {
              iVar5 = iVar5 + 1;
            }
            it->in_container_index = word._4_4_ * 0x40 + iVar5;
            it->current_value = it->highbits | it->in_container_index;
            it->has_value = true;
            return true;
          }
        }
      }
      else if (it->typecode == '\x02') {
        it->in_container_index = it->in_container_index + 1;
        if (it->in_container_index < *it->container) {
          it->current_value =
               it->highbits |
               (uint)*(ushort *)
                      (*(long *)((long)it->container + 8) + (long)it->in_container_index * 2);
          it->has_value = true;
          return true;
        }
      }
      else {
        if (it->current_value == 0xffffffff) {
          it->has_value = false;
          return false;
        }
        piVar3 = (int *)it->container;
        uVar1 = *(ushort *)(*(long *)(piVar3 + 2) + (long)it->run_index * 4);
        uVar2 = *(ushort *)(*(long *)(piVar3 + 2) + 2 + (long)it->run_index * 4);
        uVar4 = it->current_value + 1;
        it->current_value = uVar4;
        if (uVar4 <= (it->highbits | (uint)uVar1 + (uint)uVar2)) {
          it->has_value = true;
          return true;
        }
        iVar5 = it->run_index + 1;
        it->run_index = iVar5;
        if (iVar5 < *piVar3) {
          it->current_value =
               it->highbits | (uint)*(ushort *)(*(long *)(piVar3 + 2) + (long)it->run_index * 4);
          it->has_value = true;
          return true;
        }
      }
      it->container_index = it->container_index + 1;
      it_local._7_1_ = loadfirstvalue(it);
      it->has_value = it_local._7_1_;
    }
  }
  else {
    it->has_value = false;
    it_local._7_1_ = false;
  }
  return it_local._7_1_;
}

Assistant:

bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index >= it->parent->high_low_container.size) {
        return (it->has_value = false);
    }
    if (it->container_index < 0) {
        it->container_index = 0;
        return (it->has_value = loadfirstvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(it->container);
            it->in_container_index++;

            uint32_t wordindex = it->in_container_index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) break;

            uint64_t word = bc->words[wordindex] &
                   (UINT64_MAX << (it->in_container_index % 64));
            // next part could be optimized/simplified
            while ((word == 0) &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
                it->current_value = it->highbits | it->in_container_index;
                return (it->has_value = true);
            }
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(it->container);
            it->in_container_index++;
            if (it->in_container_index < ac->cardinality) {
                it->current_value =
                        it->highbits | ac->array[it->in_container_index];
                return (it->has_value = true);
            }
            break; }

        case RUN_CONTAINER_TYPE: {
            if(it->current_value == UINT32_MAX) {  // avoid overflow to zero
                return (it->has_value = false);
            }

            const run_container_t* rc = const_CAST_run(it->container);
            uint32_t limit = (it->highbits | (rc->runs[it->run_index].value +
                                              rc->runs[it->run_index].length));
            if (++it->current_value <= limit) {
                return (it->has_value = true);
            }

            if (++it->run_index < rc->n_runs) {  // Assume the run has a value
                it->current_value =
                        it->highbits | rc->runs[it->run_index].value;
                return (it->has_value = true);
            }
            break;
        }

        default:
            __builtin_unreachable();
    }

    // moving to next container
    it->container_index++;
    return (it->has_value = loadfirstvalue(it));
}